

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_string.hpp
# Opt level: O2

string * iutest::detail::ToHexString<unsigned_int>(string *__return_storage_ptr__,uint value)

{
  char cVar1;
  size_t i;
  long lVar2;
  byte bVar3;
  uint uVar4;
  char cVar5;
  allocator<char> local_19;
  char local_18 [16];
  
  local_18[0] = '\0';
  local_18[1] = '\0';
  local_18[2] = '\0';
  local_18[3] = '\0';
  local_18[4] = '\0';
  local_18[5] = '\0';
  local_18[6] = '\0';
  local_18[7] = '\0';
  bVar3 = 0x1c;
  for (lVar2 = 0; lVar2 != 8; lVar2 = lVar2 + 1) {
    uVar4 = value >> (bVar3 & 0x1f) & 0xf;
    cVar1 = (char)uVar4;
    cVar5 = cVar1 + '0';
    if (9 < uVar4) {
      cVar5 = cVar1 + '7';
    }
    local_18[lVar2] = cVar5;
    bVar3 = bVar3 - 4;
  }
  local_18[8] = 0;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,local_18,&local_19);
  return __return_storage_ptr__;
}

Assistant:

inline ::std::string ToHexString(T value)
{
    const size_t kN = sizeof(T)*2;
    char buf[kN + 1] = {0};
    for( size_t i=0; i < kN; ++i )
    {
        buf[i] = ToHex(static_cast<unsigned int>((value>>((kN-i-1)*4))));
    }
    buf[kN] = '\0';
    return buf;
}